

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O3

void __thiscall FormatterTest_FormatPointer_Test::TestBody(FormatterTest_FormatPointer_Test *this)

{
  AssertHelperData *pAVar1;
  bool bVar2;
  long *plVar3;
  AssertHelperData *pAVar4;
  char *pcVar5;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_string_view<char> format_str_02;
  basic_string_view<char> format_str_03;
  basic_string_view<char> format_str_04;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_01;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_02;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_03;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_04;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_3;
  undefined1 local_2d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  undefined1 *local_298 [2];
  undefined1 local_288 [24];
  internal local_270 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_268;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_260;
  undefined1 *local_258;
  long local_250;
  undefined8 local_248;
  undefined1 local_240 [504];
  undefined8 local_48 [3];
  
  local_260.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1234
  ;
  check_unknown_types<void*>(&local_260.ptr_,"p","pointer");
  local_298[0] = (undefined1 *)0x0;
  local_250 = 0;
  local_260.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_248 = 500;
  format_str.size_ = 3;
  format_str.data_ = "{0}";
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_298;
  args.types_ = fmt::v5::
                format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,void*>
                ::TYPES;
  local_258 = local_240;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_260,format_str,args,(locale_ref)0x0);
  pAVar1 = (AssertHelperData *)(local_2d8 + 0x10);
  local_2d8._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d8,local_258,local_258 + local_250);
  local_260.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_258 != local_240) {
    operator_delete(local_258);
  }
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&local_2b8,"\"0x0\"","format(\"{0}\", static_cast<void*>(nullptr))",
             (char (*) [4])"0x0",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8);
  if ((AssertHelperData *)local_2d8._0_8_ != pAVar1) {
    operator_delete((void *)local_2d8._0_8_);
  }
  if ((char)local_2b8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_260);
    if ((undefined8 *)local_2b8._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_2b8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x623,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2d8,(Message *)&local_260);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2d8);
    if (local_260.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_260.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_260.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_2b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_298[0] = (undefined1 *)0x1234;
  local_250 = 0;
  local_260.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_248 = 500;
  format_str_00.size_ = 3;
  format_str_00.data_ = "{0}";
  args_00.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_298;
  args_00.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,void*>
       ::TYPES;
  local_258 = local_240;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_260,format_str_00,args_00,(locale_ref)0x0);
  local_2d8._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d8,local_258,local_258 + local_250);
  local_260.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_258 != local_240) {
    operator_delete(local_258);
  }
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&local_2b8,"\"0x1234\"","format(\"{0}\", reinterpret_cast<void*>(0x1234))",
             (char (*) [7])"0x1234",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8);
  if ((AssertHelperData *)local_2d8._0_8_ != pAVar1) {
    operator_delete((void *)local_2d8._0_8_);
  }
  if ((char)local_2b8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_260);
    if ((undefined8 *)local_2b8._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_2b8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x624,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2d8,(Message *)&local_260);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2d8);
    if (local_260.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_260.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_260.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_2b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_298[0] = (undefined1 *)0x1234;
  local_250 = 0;
  local_260.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_248 = 500;
  format_str_01.size_ = 5;
  format_str_01.data_ = "{0:p}";
  args_01.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_298;
  args_01.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,void*>
       ::TYPES;
  local_258 = local_240;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_260,format_str_01,args_01,(locale_ref)0x0);
  local_2d8._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d8,local_258,local_258 + local_250);
  local_260.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_258 != local_240) {
    operator_delete(local_258);
  }
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&local_2b8,"\"0x1234\"",
             "format(\"{0:p}\", reinterpret_cast<void*>(0x1234))",(char (*) [7])"0x1234",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8);
  if ((AssertHelperData *)local_2d8._0_8_ != pAVar1) {
    operator_delete((void *)local_2d8._0_8_);
  }
  if ((char)local_2b8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_260);
    if ((undefined8 *)local_2b8._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_2b8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x625,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2d8,(Message *)&local_260);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2d8);
    if (local_260.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_260.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_260.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_2b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_298[0] = local_288;
  std::__cxx11::string::_M_construct((ulong)local_298,'\x10');
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_298,0,(char *)0x0,0x24c017);
  pAVar4 = (AssertHelperData *)(plVar3 + 2);
  if ((AssertHelperData *)*plVar3 == pAVar4) {
    local_2d8._16_8_ = *(undefined8 *)pAVar4;
    local_2d8._24_8_ = plVar3[3];
    local_2d8._0_8_ = pAVar1;
  }
  else {
    local_2d8._16_8_ = *(undefined8 *)pAVar4;
    local_2d8._0_8_ = (AssertHelperData *)*plVar3;
  }
  local_2d8._8_8_ = plVar3[1];
  *plVar3 = (long)pAVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_48[0] = 0xffffffffffffffff;
  local_250 = 0;
  local_260.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_248 = 500;
  format_str_02.size_ = 3;
  format_str_02.data_ = "{0}";
  args_02.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_48;
  args_02.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,void*>
       ::TYPES;
  local_258 = local_240;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_260,format_str_02,args_02,(locale_ref)0x0);
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2b8,local_258,local_258 + local_250);
  local_260.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_258 != local_240) {
    operator_delete(local_258);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_270,"\"0x\" + std::string(sizeof(void*) * 8 / 4, \'f\')",
             "format(\"{0}\", reinterpret_cast<void*>(~uintptr_t()))",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
             &local_2b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  if ((AssertHelperData *)local_2d8._0_8_ != pAVar1) {
    operator_delete((void *)local_2d8._0_8_);
  }
  if (local_298[0] != local_288) {
    operator_delete(local_298[0]);
  }
  if (local_270[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_260);
    if (local_268.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_268.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x627,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2d8,(Message *)&local_260);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2d8);
    if (local_260.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_260.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_260.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_268,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_298[0] = (undefined1 *)0x1234;
  local_250 = 0;
  local_260.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_248 = 500;
  format_str_03.size_ = 2;
  format_str_03.data_ = "{}";
  args_03.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_298;
  args_03.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,void_const*>
       ::TYPES;
  local_258 = local_240;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_260,format_str_03,args_03,(locale_ref)0x0);
  local_2d8._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d8,local_258,local_258 + local_250);
  local_260.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_258 != local_240) {
    operator_delete(local_258);
  }
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&local_2b8,"\"0x1234\"",
             "format(\"{}\", fmt::ptr(reinterpret_cast<int*>(0x1234)))",(char (*) [7])"0x1234",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8);
  if ((AssertHelperData *)local_2d8._0_8_ != pAVar1) {
    operator_delete((void *)local_2d8._0_8_);
  }
  if ((char)local_2b8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_260);
    if ((undefined8 *)local_2b8._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_2b8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x628,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2d8,(Message *)&local_260);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2d8);
    if (local_260.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_260.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_260.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_2b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_298[0] = (undefined1 *)0x0;
  local_250 = 0;
  local_260.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_248 = 500;
  format_str_04.size_ = 2;
  format_str_04.data_ = "{}";
  args_04.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_298;
  args_04.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,decltype(nullptr)>
       ::TYPES;
  local_258 = local_240;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_260,format_str_04,args_04,(locale_ref)0x0);
  local_2d8._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d8,local_258,local_258 + local_250);
  local_260.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_258 != local_240) {
    operator_delete(local_258);
  }
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&local_2b8,"\"0x0\"","format(\"{}\", nullptr)",(char (*) [4])"0x0",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8);
  if ((AssertHelperData *)local_2d8._0_8_ != pAVar1) {
    operator_delete((void *)local_2d8._0_8_);
  }
  if ((char)local_2b8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_260);
    if ((undefined8 *)local_2b8._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_2b8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x62a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2d8,(Message *)&local_260);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2d8);
    if (local_260.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_260.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_260.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_2b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(FormatterTest, FormatPointer) {
  check_unknown_types(reinterpret_cast<void*>(0x1234), "p", "pointer");
  EXPECT_EQ("0x0", format("{0}", static_cast<void*>(FMT_NULL)));
  EXPECT_EQ("0x1234", format("{0}", reinterpret_cast<void*>(0x1234)));
  EXPECT_EQ("0x1234", format("{0:p}", reinterpret_cast<void*>(0x1234)));
  EXPECT_EQ("0x" + std::string(sizeof(void*) * CHAR_BIT / 4, 'f'),
      format("{0}", reinterpret_cast<void*>(~uintptr_t())));
  EXPECT_EQ("0x1234", format("{}", fmt::ptr(reinterpret_cast<int*>(0x1234))));
#if FMT_USE_NULLPTR
  EXPECT_EQ("0x0", format("{}", FMT_NULL));
#endif
}